

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::TextFlow::Columns::iterator::iterator(void *param_1,undefined8 param_2)

{
  bool bVar1;
  Column *this;
  Column *col;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_> *__range3;
  value_type *in_stack_ffffffffffffff68;
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff98;
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
  local_38;
  undefined8 local_30;
  undefined8 local_18;
  void *local_10;
  
  *(undefined8 *)param_1 = param_2;
  this = (Column *)((long)param_1 + 8);
  local_18 = param_2;
  local_10 = param_1;
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::vector((vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
            *)0x350ebd);
  *(undefined8 *)((long)param_1 + 0x20) = 0;
  std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::size
            (*param_1);
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::reserve(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_30 = *param_1;
  local_38._M_current =
       (Column *)
       std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
       ::begin((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                *)in_stack_ffffffffffffff68);
  std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::end
            ((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
              *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
    ::operator*(&local_38);
    in_stack_ffffffffffffff70 =
         (vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
          *)((long)param_1 + 8);
    Column::end(this);
    std::
    vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
    ::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

iterator(Columns const& columns, EndTag)
			: m_columns(columns.m_columns),
			m_activeIterators(0) {
			m_iterators.reserve(m_columns.size());

			for (auto const& col : m_columns)
				m_iterators.push_back(col.end());
		}